

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O3

QBitmap * __thiscall QPlatformPixmap::mask(QBitmap *__return_storage_ptr__,QPlatformPixmap *this)

{
  bool bVar1;
  int iVar2;
  Format FVar3;
  int height;
  QRgb QVar4;
  size_t __n;
  uchar *puVar5;
  uchar *__s;
  ulong uVar6;
  int i;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_a8 [16];
  QImageData *local_98;
  undefined1 local_88 [16];
  QImageData *local_78;
  QImage local_68;
  QColor local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*this->_vptr_QPlatformPixmap[0xf])(this);
  if ((char)iVar2 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QBitmap::QBitmap(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    goto LAB_002b5e43;
  }
  local_68.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
  local_68.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
  local_68.super_QPaintDevice.painters = 0xaaaa;
  local_68.super_QPaintDevice._10_2_ = 0xaaaa;
  local_68.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
  (*this->_vptr_QPlatformPixmap[0x11])(&local_68,this);
  FVar3 = QImage::format(&local_68);
  if (FVar3 == Format_ARGB32) {
LAB_002b5c75:
    local_78 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_88,&local_68);
  }
  else {
    FVar3 = QImage::format(&local_68);
    local_78 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (FVar3 == Format_ARGB32_Premultiplied) goto LAB_002b5c75;
    QImage::convertToFormat
              ((QImage *)local_88,&local_68,Format_ARGB32_Premultiplied,(ImageConversionFlags)0x0);
  }
  iVar2 = QImage::width((QImage *)local_88);
  height = QImage::height((QImage *)local_88);
  local_98 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_a8,iVar2,height,Format_MonoLSB);
  bVar1 = QImage::isNull((QImage *)local_a8);
  if (bVar1) {
    QBitmap::QBitmap(__return_storage_ptr__);
  }
  else {
    (*this->_vptr_QPlatformPixmap[0x14])(this);
    QImage::setDevicePixelRatio
              ((QImage *)local_a8,(qreal)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    QImage::setColorCount((QImage *)local_a8,2);
    i = 0;
    QColor::QColor(&local_48,color0);
    QVar4 = QColor::rgba(&local_48);
    QImage::setColor((QImage *)local_a8,0,QVar4);
    QColor::QColor(&local_48,color1);
    QVar4 = QColor::rgba(&local_48);
    QImage::setColor((QImage *)local_a8,1,QVar4);
    __n = QImage::bytesPerLine((QImage *)local_a8);
    if (0 < height) {
      do {
        puVar5 = QImage::scanLine((QImage *)local_88,i);
        __s = QImage::scanLine((QImage *)local_a8,i);
        memset(__s,0,__n);
        if (0 < iVar2) {
          uVar6 = 0;
          do {
            if (0xffffff < *(uint *)(puVar5 + uVar6 * 4)) {
              __s[uVar6 >> 3 & 0x1fffffff] =
                   __s[uVar6 >> 3 & 0x1fffffff] | (byte)(1 << ((byte)uVar6 & 7));
            }
            uVar6 = uVar6 + 1;
          } while (iVar2 != (int)uVar6);
        }
        i = i + 1;
      } while (i != height);
    }
    QBitmap::fromImage(__return_storage_ptr__,(QImage *)local_a8,(ImageConversionFlags)0x0);
  }
  QImage::~QImage((QImage *)local_a8);
  QImage::~QImage((QImage *)local_88);
  QImage::~QImage(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002b5e43:
  __stack_chk_fail();
}

Assistant:

QBitmap QPlatformPixmap::mask() const
{
    if (!hasAlphaChannel())
        return QBitmap();

    QImage img = toImage();
    bool shouldConvert = (img.format() != QImage::Format_ARGB32 && img.format() != QImage::Format_ARGB32_Premultiplied);
    const QImage image = (shouldConvert ? std::move(img).convertToFormat(QImage::Format_ARGB32_Premultiplied) : img);
    const int w = image.width();
    const int h = image.height();

    QImage mask(w, h, QImage::Format_MonoLSB);
    if (mask.isNull()) // allocation failed
        return QBitmap();

    mask.setDevicePixelRatio(devicePixelRatio());
    mask.setColorCount(2);
    mask.setColor(0, QColor(Qt::color0).rgba());
    mask.setColor(1, QColor(Qt::color1).rgba());

    const qsizetype bpl = mask.bytesPerLine();

    for (int y = 0; y < h; ++y) {
        const QRgb *src = reinterpret_cast<const QRgb*>(image.scanLine(y));
        uchar *dest = mask.scanLine(y);
        memset(dest, 0, bpl);
        for (int x = 0; x < w; ++x) {
            if (qAlpha(*src) > 0)
                dest[x >> 3] |= (1 << (x & 7));
            ++src;
        }
    }

    return QBitmap::fromImage(std::move(mask));
}